

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall re2::Prog::ComputeByteMap(Prog *this)

{
  uint32 k;
  uint32 uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  InstOp IVar5;
  EmptyOp EVar6;
  Inst *this_00;
  uint local_5c;
  uint local_58;
  int i_1;
  uint32 bits;
  uint32 uStack_4c;
  uint8 n;
  int i;
  int j;
  int hi;
  int lo;
  Inst *ip;
  int id;
  bool done_word_boundaries;
  Bitmap<256> v;
  Prog *this_local;
  
  v.w_._24_8_ = this;
  Bitmap<256>::Bitmap((Bitmap<256> *)&id);
  bVar2 = false;
  for (ip._0_4_ = 0; iVar4 = size(this), (int)ip < iVar4; ip._0_4_ = (int)ip + 1) {
    this_00 = inst(this,(int)ip);
    IVar5 = Inst::opcode(this_00);
    if (IVar5 == kInstByteRange) {
      j = Inst::lo(this_00);
      i = Inst::hi(this_00);
      if (0 < j) {
        Bitmap<256>::Set((Bitmap<256> *)&id,j + -1);
      }
      Bitmap<256>::Set((Bitmap<256> *)&id,i);
      iVar4 = Inst::foldcase(this_00);
      if (((iVar4 != 0) && (j < 0x7b)) && (0x60 < i)) {
        if (j < 0x61) {
          j = 0x61;
        }
        if (0x7a < i) {
          i = 0x7a;
        }
        if (j <= i) {
          Bitmap<256>::Set((Bitmap<256> *)&id,j + -0x21);
          Bitmap<256>::Set((Bitmap<256> *)&id,i + -0x20);
        }
      }
    }
    else {
      IVar5 = Inst::opcode(this_00);
      if (IVar5 == kInstEmptyWidth) {
        EVar6 = Inst::empty(this_00);
        if ((EVar6 & (kEmptyEndLine|kEmptyBeginLine)) != 0) {
          Bitmap<256>::Set((Bitmap<256> *)&id,9);
          Bitmap<256>::Set((Bitmap<256> *)&id,10);
        }
        EVar6 = Inst::empty(this_00);
        if (((EVar6 & (kEmptyNonWordBoundary|kEmptyWordBoundary)) != 0) && (!bVar2)) {
          bits = 0;
          while (uVar1 = bits, (int)bits < 0x100) {
            do {
              k = uVar1;
              uStack_4c = k + 1;
              bVar2 = false;
              if ((int)uStack_4c < 0x100) {
                bVar2 = IsWordChar((uint8)bits);
                bVar3 = IsWordChar((uint8)uStack_4c);
                bVar2 = bVar2 == bVar3;
              }
              uVar1 = uStack_4c;
            } while (bVar2);
            if (0 < (int)bits) {
              Bitmap<256>::Set((Bitmap<256> *)&id,bits - 1);
            }
            Bitmap<256>::Set((Bitmap<256> *)&id,k);
            bits = uStack_4c;
          }
          bVar2 = true;
        }
      }
    }
  }
  i_1._3_1_ = '\0';
  local_58 = 0;
  for (local_5c = 0; (int)local_5c < 0x100; local_5c = local_5c + 1) {
    if ((local_5c & 0x1f) == 0) {
      local_58 = Bitmap<256>::Word((Bitmap<256> *)&id,(int)local_5c >> 5);
    }
    this->bytemap_[(int)local_5c] = i_1._3_1_;
    i_1._3_1_ = i_1._3_1_ + ((byte)local_58 & 1);
    local_58 = local_58 >> 1;
  }
  this->bytemap_range_ = this->bytemap_[0xff] + 1;
  return;
}

Assistant:

void Prog::ComputeByteMap() {
  // Fill in byte map with byte classes for the program.
  // Ranges of bytes that are treated indistinguishably
  // are mapped to a single byte class.
  Bitmap<256> v;

  // Don't repeat the work for \b and \B.
  bool done_word_boundaries = false;

  for (int id = 0; id < static_cast<int>(size()); id++) {
    Inst* ip = inst(id);
    if (ip->opcode() == kInstByteRange) {
      int lo = ip->lo();
      int hi = ip->hi();
      if (0 < lo)
        v.Set(lo - 1);
      v.Set(hi);
      if (ip->foldcase() && lo <= 'z' && hi >= 'a') {
        if (lo < 'a')
          lo = 'a';
        if (hi > 'z')
          hi = 'z';
        if (lo <= hi) {
          v.Set(lo + 'A' - 'a' - 1);
          v.Set(hi + 'A' - 'a');
        }
      }
    } else if (ip->opcode() == kInstEmptyWidth) {
      if (ip->empty() & (kEmptyBeginLine|kEmptyEndLine)) {
        v.Set('\n' - 1);
        v.Set('\n');
      }
      if (ip->empty() & (kEmptyWordBoundary|kEmptyNonWordBoundary)) {
        if (done_word_boundaries)
          continue;
        int j;
        for (int i = 0; i < 256; i = j) {
          for (j = i + 1; j < 256 &&
                          Prog::IsWordChar(static_cast<uint8>(i)) ==
                              Prog::IsWordChar(static_cast<uint8>(j));
               j++)
            ;
          if (0 < i)
            v.Set(i - 1);
          v.Set(j - 1);
        }
        done_word_boundaries = true;
      }
    }
  }

  COMPILE_ASSERT(8*sizeof(v.Word(0)) == 32, wordsize);
  uint8 n = 0;
  uint32 bits = 0;
  for (int i = 0; i < 256; i++) {
    if ((i & 31) == 0)
      bits = v.Word(i >> 5);
    bytemap_[i] = n;
    n += bits & 1;
    bits >>= 1;
  }
  bytemap_range_ = bytemap_[255] + 1;

  if (0) {  // For debugging: use trivial byte map.
    for (int i = 0; i < 256; i++)
      bytemap_[i] = static_cast<uint8>(i);
    bytemap_range_ = 256;
    LOG(INFO) << "Using trivial bytemap.";
  }
}